

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# content_type_parser_test.cpp
# Opt level: O3

int main(void)

{
  char cVar1;
  int iVar2;
  ostream *poVar3;
  runtime_error *prVar4;
  content_type t;
  ostringstream oss;
  undefined1 *local_1d0 [2];
  undefined1 local_1c0 [16];
  content_type local_1b0 [16];
  undefined1 *local_1a0 [2];
  undefined1 local_190 [360];
  
  cppcms::http::content_type::content_type(local_1b0,"hello/world");
  cppcms::http::content_type::type_abi_cxx11_();
  iVar2 = std::__cxx11::string::compare((char *)local_1a0);
  if (local_1a0[0] != local_190) {
    operator_delete(local_1a0[0]);
  }
  if (iVar2 != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a0,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/content_type_parser_test.cpp"
               ,0x6b);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,":",1);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)local_1a0,0x15);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," t.type()==\"hello\"",0x12);
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar4,(string *)local_1d0);
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  cppcms::http::content_type::subtype_abi_cxx11_();
  iVar2 = std::__cxx11::string::compare((char *)local_1a0);
  if (local_1a0[0] != local_190) {
    operator_delete(local_1a0[0]);
  }
  if (iVar2 != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a0,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/content_type_parser_test.cpp"
               ,0x6b);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,":",1);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)local_1a0,0x16);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," t.subtype()==\"world\"",0x15);
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar4,(string *)local_1d0);
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  cppcms::http::content_type::media_type_abi_cxx11_();
  iVar2 = std::__cxx11::string::compare((char *)local_1a0);
  if (local_1a0[0] != local_190) {
    operator_delete(local_1a0[0]);
  }
  if (iVar2 != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a0,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/content_type_parser_test.cpp"
               ,0x6b);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,":",1);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)local_1a0,0x17);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3," t.media_type()==\"hello/world\"",0x1e);
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar4,(string *)local_1d0);
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  cppcms::http::content_type::~content_type(local_1b0);
  cppcms::http::content_type::content_type(local_1b0,"Hello/WORLD; chaRset=UTF-8");
  cppcms::http::content_type::type_abi_cxx11_();
  iVar2 = std::__cxx11::string::compare((char *)local_1a0);
  if (local_1a0[0] != local_190) {
    operator_delete(local_1a0[0]);
  }
  if (iVar2 != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a0,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/content_type_parser_test.cpp"
               ,0x6b);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,":",1);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)local_1a0,0x1b);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," t.type()==\"hello\"",0x12);
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar4,(string *)local_1d0);
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  cppcms::http::content_type::subtype_abi_cxx11_();
  iVar2 = std::__cxx11::string::compare((char *)local_1a0);
  if (local_1a0[0] != local_190) {
    operator_delete(local_1a0[0]);
  }
  if (iVar2 != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a0,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/content_type_parser_test.cpp"
               ,0x6b);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,":",1);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)local_1a0,0x1c);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," t.subtype()==\"world\"",0x15);
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar4,(string *)local_1d0);
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  cppcms::http::content_type::media_type_abi_cxx11_();
  iVar2 = std::__cxx11::string::compare((char *)local_1a0);
  if (local_1a0[0] != local_190) {
    operator_delete(local_1a0[0]);
  }
  if (iVar2 != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a0,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/content_type_parser_test.cpp"
               ,0x6b);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,":",1);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)local_1a0,0x1d);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3," t.media_type()==\"hello/world\"",0x1e);
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar4,(string *)local_1d0);
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_1a0[0] = local_190;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a0,"charset","");
  cVar1 = cppcms::http::content_type::parameter_is_set((string *)local_1b0);
  if (local_1a0[0] != local_190) {
    operator_delete(local_1a0[0]);
  }
  if (cVar1 == '\0') {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a0,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/content_type_parser_test.cpp"
               ,0x6b);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,":",1);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)local_1a0,0x1e);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3," t.parameter_is_set(\"charset\")",0x1e);
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar4,(string *)local_1d0);
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_1a0[0] = local_190;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a0,"xx","");
  cVar1 = cppcms::http::content_type::parameter_is_set((string *)local_1b0);
  if (local_1a0[0] != local_190) {
    operator_delete(local_1a0[0]);
  }
  if (cVar1 != '\0') {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a0,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/content_type_parser_test.cpp"
               ,0x6b);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,":",1);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)local_1a0,0x1f);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," !t.parameter_is_set(\"xx\")",0x1a);
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar4,(string *)local_1d0);
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  cppcms::http::content_type::charset_abi_cxx11_();
  iVar2 = std::__cxx11::string::compare((char *)local_1a0);
  if (local_1a0[0] != local_190) {
    operator_delete(local_1a0[0]);
  }
  if (iVar2 != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a0,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/content_type_parser_test.cpp"
               ,0x6b);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,":",1);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)local_1a0,0x20);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," t.charset()==\"UTF-8\"",0x15);
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar4,(string *)local_1d0);
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  cppcms::http::content_type::~content_type(local_1b0);
  cppcms::http::content_type::content_type(local_1b0,"hello/world ; chaRset=\"UTF-8\"");
  cppcms::http::content_type::type_abi_cxx11_();
  iVar2 = std::__cxx11::string::compare((char *)local_1a0);
  if (local_1a0[0] != local_190) {
    operator_delete(local_1a0[0]);
  }
  if (iVar2 != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a0,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/content_type_parser_test.cpp"
               ,0x6b);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,":",1);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)local_1a0,0x24);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," t.type()==\"hello\"",0x12);
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar4,(string *)local_1d0);
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  cppcms::http::content_type::subtype_abi_cxx11_();
  iVar2 = std::__cxx11::string::compare((char *)local_1a0);
  if (local_1a0[0] != local_190) {
    operator_delete(local_1a0[0]);
  }
  if (iVar2 == 0) {
    cppcms::http::content_type::media_type_abi_cxx11_();
    iVar2 = std::__cxx11::string::compare((char *)local_1a0);
    if (local_1a0[0] != local_190) {
      operator_delete(local_1a0[0]);
    }
    if (iVar2 != 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"Error ",6);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a0,
                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/content_type_parser_test.cpp"
                 ,0x6b);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,":",1);
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)local_1a0,0x26);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar3," t.media_type()==\"hello/world\"",0x1e);
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar4,(string *)local_1d0);
      __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    cppcms::http::content_type::charset_abi_cxx11_();
    iVar2 = std::__cxx11::string::compare((char *)local_1a0);
    if (local_1a0[0] != local_190) {
      operator_delete(local_1a0[0]);
    }
    if (iVar2 != 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"Error ",6);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a0,
                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/content_type_parser_test.cpp"
                 ,0x6b);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,":",1);
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)local_1a0,0x27);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," t.charset()==\"UTF-8\"",0x15);
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar4,(string *)local_1d0);
      __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    local_1a0[0] = local_190;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1a0,"charset","");
    cVar1 = cppcms::http::content_type::parameter_is_set((string *)local_1b0);
    if (local_1a0[0] != local_190) {
      operator_delete(local_1a0[0]);
    }
    if (cVar1 == '\0') {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"Error ",6);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a0,
                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/content_type_parser_test.cpp"
                 ,0x6b);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,":",1);
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)local_1a0,0x28);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar3," t.parameter_is_set(\"charset\")",0x1e);
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar4,(string *)local_1d0);
      __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    cppcms::http::content_type::~content_type(local_1b0);
    cppcms::http::content_type::content_type
              (local_1b0,"hello/world; foo=1; bar=2; beep=\"x\\\"\"; zee=hello");
    cppcms::http::content_type::type_abi_cxx11_();
    iVar2 = std::__cxx11::string::compare((char *)local_1a0);
    if (local_1a0[0] != local_190) {
      operator_delete(local_1a0[0]);
    }
    if (iVar2 != 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"Error ",6);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a0,
                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/content_type_parser_test.cpp"
                 ,0x6b);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,":",1);
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)local_1a0,0x2c);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," t.type()==\"hello\"",0x12);
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar4,(string *)local_1d0);
      __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    cppcms::http::content_type::subtype_abi_cxx11_();
    iVar2 = std::__cxx11::string::compare((char *)local_1a0);
    if (local_1a0[0] != local_190) {
      operator_delete(local_1a0[0]);
    }
    if (iVar2 != 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"Error ",6);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a0,
                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/content_type_parser_test.cpp"
                 ,0x6b);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,":",1);
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)local_1a0,0x2d);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," t.subtype()==\"world\"",0x15);
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar4,(string *)local_1d0);
      __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    cppcms::http::content_type::media_type_abi_cxx11_();
    iVar2 = std::__cxx11::string::compare((char *)local_1a0);
    if (local_1a0[0] != local_190) {
      operator_delete(local_1a0[0]);
    }
    if (iVar2 != 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"Error ",6);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a0,
                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/content_type_parser_test.cpp"
                 ,0x6b);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,":",1);
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)local_1a0,0x2e);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar3," t.media_type()==\"hello/world\"",0x1e);
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar4,(string *)local_1d0);
      __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    local_1d0[0] = local_1c0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1d0,"foo","");
    cppcms::http::content_type::parameter_by_key((string *)local_1a0);
    iVar2 = std::__cxx11::string::compare((char *)local_1a0);
    if (local_1a0[0] != local_190) {
      operator_delete(local_1a0[0]);
    }
    if (local_1d0[0] != local_1c0) {
      operator_delete(local_1d0[0]);
    }
    if (iVar2 != 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"Error ",6);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a0,
                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/content_type_parser_test.cpp"
                 ,0x6b);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,":",1);
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)local_1a0,0x2f);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar3," t.parameter_by_key(\"foo\")==\"1\"",0x1f);
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar4,(string *)local_1d0);
      __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    local_1d0[0] = local_1c0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1d0,"bar","");
    cppcms::http::content_type::parameter_by_key((string *)local_1a0);
    iVar2 = std::__cxx11::string::compare((char *)local_1a0);
    if (local_1a0[0] != local_190) {
      operator_delete(local_1a0[0]);
    }
    if (local_1d0[0] != local_1c0) {
      operator_delete(local_1d0[0]);
    }
    if (iVar2 != 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"Error ",6);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a0,
                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/content_type_parser_test.cpp"
                 ,0x6b);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,":",1);
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)local_1a0,0x30);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar3," t.parameter_by_key(\"bar\")==\"2\"",0x1f);
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar4,(string *)local_1d0);
      __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    local_1d0[0] = local_1c0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1d0,"beep","");
    cppcms::http::content_type::parameter_by_key((string *)local_1a0);
    iVar2 = std::__cxx11::string::compare((char *)local_1a0);
    if (local_1a0[0] != local_190) {
      operator_delete(local_1a0[0]);
    }
    if (local_1d0[0] != local_1c0) {
      operator_delete(local_1d0[0]);
    }
    if (iVar2 == 0) {
      local_1d0[0] = local_1c0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1d0,"zee","");
      cppcms::http::content_type::parameter_by_key((string *)local_1a0);
      iVar2 = std::__cxx11::string::compare((char *)local_1a0);
      if (local_1a0[0] != local_190) {
        operator_delete(local_1a0[0]);
      }
      if (local_1d0[0] != local_1c0) {
        operator_delete(local_1d0[0]);
      }
      if (iVar2 != 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"Error ",6);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a0,
                   "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/content_type_parser_test.cpp"
                   ,0x6b);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,":",1);
        poVar3 = (ostream *)std::ostream::operator<<((ostream *)local_1a0,0x32);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar3," t.parameter_by_key(\"zee\")==\"hello\"",0x23);
        prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::runtime_error::runtime_error(prVar4,(string *)local_1d0);
        __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      local_1d0[0] = local_1c0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1d0,"x","");
      cppcms::http::content_type::parameter_by_key((string *)local_1a0);
      iVar2 = std::__cxx11::string::compare((char *)local_1a0);
      if (local_1a0[0] != local_190) {
        operator_delete(local_1a0[0]);
      }
      if (local_1d0[0] != local_1c0) {
        operator_delete(local_1d0[0]);
      }
      if (iVar2 != 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"Error ",6);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a0,
                   "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/content_type_parser_test.cpp"
                   ,0x6b);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,":",1);
        poVar3 = (ostream *)std::ostream::operator<<((ostream *)local_1a0,0x33);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar3," t.parameter_by_key(\"x\")==\"\"",0x1c);
        prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::runtime_error::runtime_error(prVar4,(string *)local_1d0);
        __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      cppcms::http::content_type::~content_type(local_1b0);
      cppcms::http::content_type::content_type(local_1b0,"foo");
      cppcms::http::content_type::type_abi_cxx11_();
      iVar2 = std::__cxx11::string::compare((char *)local_1a0);
      if (local_1a0[0] != local_190) {
        operator_delete(local_1a0[0]);
      }
      if (iVar2 != 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"Error ",6);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a0,
                   "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/content_type_parser_test.cpp"
                   ,0x6b);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,":",1);
        poVar3 = (ostream *)std::ostream::operator<<((ostream *)local_1a0,0x37);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3," t.type()==\"\"",0xd);
        prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::runtime_error::runtime_error(prVar4,(string *)local_1d0);
        __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      cppcms::http::content_type::subtype_abi_cxx11_();
      iVar2 = std::__cxx11::string::compare((char *)local_1a0);
      if (local_1a0[0] != local_190) {
        operator_delete(local_1a0[0]);
      }
      if (iVar2 != 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"Error ",6);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a0,
                   "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/content_type_parser_test.cpp"
                   ,0x6b);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,":",1);
        poVar3 = (ostream *)std::ostream::operator<<((ostream *)local_1a0,0x38);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3," t.subtype()==\"\"",0x10);
        prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::runtime_error::runtime_error(prVar4,(string *)local_1d0);
        __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      cppcms::http::content_type::media_type_abi_cxx11_();
      iVar2 = std::__cxx11::string::compare((char *)local_1a0);
      if (local_1a0[0] != local_190) {
        operator_delete(local_1a0[0]);
      }
      if (iVar2 != 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"Error ",6);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a0,
                   "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/content_type_parser_test.cpp"
                   ,0x6b);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,":",1);
        poVar3 = (ostream *)std::ostream::operator<<((ostream *)local_1a0,0x39);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3," t.media_type()==\"\"",0x13);
        prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::runtime_error::runtime_error(prVar4,(string *)local_1d0);
        __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      cppcms::http::content_type::~content_type(local_1b0);
      cppcms::http::content_type::content_type(local_1b0,"foo/");
      cppcms::http::content_type::type_abi_cxx11_();
      iVar2 = std::__cxx11::string::compare((char *)local_1a0);
      if (local_1a0[0] != local_190) {
        operator_delete(local_1a0[0]);
      }
      if (iVar2 != 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"Error ",6);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a0,
                   "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/content_type_parser_test.cpp"
                   ,0x6b);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,":",1);
        poVar3 = (ostream *)std::ostream::operator<<((ostream *)local_1a0,0x3d);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3," t.type()==\"\"",0xd);
        prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::runtime_error::runtime_error(prVar4,(string *)local_1d0);
        __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      cppcms::http::content_type::subtype_abi_cxx11_();
      iVar2 = std::__cxx11::string::compare((char *)local_1a0);
      if (local_1a0[0] != local_190) {
        operator_delete(local_1a0[0]);
      }
      if (iVar2 != 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"Error ",6);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a0,
                   "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/content_type_parser_test.cpp"
                   ,0x6b);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,":",1);
        poVar3 = (ostream *)std::ostream::operator<<((ostream *)local_1a0,0x3e);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3," t.subtype()==\"\"",0x10);
        prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::runtime_error::runtime_error(prVar4,(string *)local_1d0);
        __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      cppcms::http::content_type::media_type_abi_cxx11_();
      iVar2 = std::__cxx11::string::compare((char *)local_1a0);
      if (local_1a0[0] != local_190) {
        operator_delete(local_1a0[0]);
      }
      if (iVar2 != 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"Error ",6);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a0,
                   "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/content_type_parser_test.cpp"
                   ,0x6b);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,":",1);
        poVar3 = (ostream *)std::ostream::operator<<((ostream *)local_1a0,0x3f);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3," t.media_type()==\"\"",0x13);
        prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::runtime_error::runtime_error(prVar4,(string *)local_1d0);
        __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      cppcms::http::content_type::~content_type(local_1b0);
      cppcms::http::content_type::content_type(local_1b0,"/foo");
      cppcms::http::content_type::type_abi_cxx11_();
      iVar2 = std::__cxx11::string::compare((char *)local_1a0);
      if (local_1a0[0] != local_190) {
        operator_delete(local_1a0[0]);
      }
      if (iVar2 == 0) {
        cppcms::http::content_type::subtype_abi_cxx11_();
        iVar2 = std::__cxx11::string::compare((char *)local_1a0);
        if (local_1a0[0] != local_190) {
          operator_delete(local_1a0[0]);
        }
        if (iVar2 != 0) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"Error ",6);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a0,
                     "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/content_type_parser_test.cpp"
                     ,0x6b);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,":",1);
          poVar3 = (ostream *)std::ostream::operator<<((ostream *)local_1a0,0x44);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3," t.subtype()==\"\"",0x10);
          prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::__cxx11::stringbuf::str();
          std::runtime_error::runtime_error(prVar4,(string *)local_1d0);
          __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        cppcms::http::content_type::media_type_abi_cxx11_();
        iVar2 = std::__cxx11::string::compare((char *)local_1a0);
        if (local_1a0[0] != local_190) {
          operator_delete(local_1a0[0]);
        }
        if (iVar2 != 0) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"Error ",6);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a0,
                     "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/content_type_parser_test.cpp"
                     ,0x6b);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,":",1);
          poVar3 = (ostream *)std::ostream::operator<<((ostream *)local_1a0,0x45);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3," t.media_type()==\"\"",0x13);
          prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::__cxx11::stringbuf::str();
          std::runtime_error::runtime_error(prVar4,(string *)local_1d0);
          __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        cppcms::http::content_type::~content_type(local_1b0);
        cppcms::http::content_type::content_type(local_1b0,"foo/bar;; charset=UTF-8");
        cppcms::http::content_type::type_abi_cxx11_();
        iVar2 = std::__cxx11::string::compare((char *)local_1a0);
        if (local_1a0[0] != local_190) {
          operator_delete(local_1a0[0]);
        }
        if (iVar2 != 0) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"Error ",6);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a0,
                     "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/content_type_parser_test.cpp"
                     ,0x6b);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,":",1);
          poVar3 = (ostream *)std::ostream::operator<<((ostream *)local_1a0,0x49);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3," t.type()==\"foo\"",0x10);
          prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::__cxx11::stringbuf::str();
          std::runtime_error::runtime_error(prVar4,(string *)local_1d0);
          __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        cppcms::http::content_type::subtype_abi_cxx11_();
        iVar2 = std::__cxx11::string::compare((char *)local_1a0);
        if (local_1a0[0] != local_190) {
          operator_delete(local_1a0[0]);
        }
        if (iVar2 != 0) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"Error ",6);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a0,
                     "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/content_type_parser_test.cpp"
                     ,0x6b);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,":",1);
          poVar3 = (ostream *)std::ostream::operator<<((ostream *)local_1a0,0x4a);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3," t.subtype()==\"bar\"",0x13);
          prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::__cxx11::stringbuf::str();
          std::runtime_error::runtime_error(prVar4,(string *)local_1d0);
          __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        cppcms::http::content_type::media_type_abi_cxx11_();
        iVar2 = std::__cxx11::string::compare((char *)local_1a0);
        if (local_1a0[0] != local_190) {
          operator_delete(local_1a0[0]);
        }
        if (iVar2 != 0) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"Error ",6);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a0,
                     "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/content_type_parser_test.cpp"
                     ,0x6b);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,":",1);
          poVar3 = (ostream *)std::ostream::operator<<((ostream *)local_1a0,0x4b);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar3," t.media_type()==\"foo/bar\"",0x1a);
          prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::__cxx11::stringbuf::str();
          std::runtime_error::runtime_error(prVar4,(string *)local_1d0);
          __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        cppcms::http::content_type::charset_abi_cxx11_();
        iVar2 = std::__cxx11::string::compare((char *)local_1a0);
        if (local_1a0[0] != local_190) {
          operator_delete(local_1a0[0]);
        }
        if (iVar2 != 0) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"Error ",6);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a0,
                     "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/content_type_parser_test.cpp"
                     ,0x6b);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,":",1);
          poVar3 = (ostream *)std::ostream::operator<<((ostream *)local_1a0,0x4c);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3," t.charset()==\"\"",0x10);
          prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::__cxx11::stringbuf::str();
          std::runtime_error::runtime_error(prVar4,(string *)local_1d0);
          __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        cppcms::http::content_type::~content_type(local_1b0);
        cppcms::http::content_type::content_type(local_1b0,"foo/bar; charset=\"UTF-8");
        cppcms::http::content_type::type_abi_cxx11_();
        iVar2 = std::__cxx11::string::compare((char *)local_1a0);
        if (local_1a0[0] != local_190) {
          operator_delete(local_1a0[0]);
        }
        if (iVar2 != 0) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"Error ",6);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a0,
                     "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/content_type_parser_test.cpp"
                     ,0x6b);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,":",1);
          poVar3 = (ostream *)std::ostream::operator<<((ostream *)local_1a0,0x50);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3," t.type()==\"foo\"",0x10);
          prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::__cxx11::stringbuf::str();
          std::runtime_error::runtime_error(prVar4,(string *)local_1d0);
          __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        cppcms::http::content_type::subtype_abi_cxx11_();
        iVar2 = std::__cxx11::string::compare((char *)local_1a0);
        if (local_1a0[0] != local_190) {
          operator_delete(local_1a0[0]);
        }
        if (iVar2 != 0) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"Error ",6);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a0,
                     "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/content_type_parser_test.cpp"
                     ,0x6b);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,":",1);
          poVar3 = (ostream *)std::ostream::operator<<((ostream *)local_1a0,0x51);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3," t.subtype()==\"bar\"",0x13);
          prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::__cxx11::stringbuf::str();
          std::runtime_error::runtime_error(prVar4,(string *)local_1d0);
          __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        cppcms::http::content_type::media_type_abi_cxx11_();
        iVar2 = std::__cxx11::string::compare((char *)local_1a0);
        if (local_1a0[0] != local_190) {
          operator_delete(local_1a0[0]);
        }
        if (iVar2 == 0) {
          cppcms::http::content_type::charset_abi_cxx11_();
          iVar2 = std::__cxx11::string::compare((char *)local_1a0);
          if (local_1a0[0] != local_190) {
            operator_delete(local_1a0[0]);
          }
          if (iVar2 == 0) {
            cppcms::http::content_type::~content_type(local_1b0);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Ok",2);
            std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
            std::ostream::put('h');
            std::ostream::flush();
            return 0;
          }
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"Error ",6);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a0,
                     "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/content_type_parser_test.cpp"
                     ,0x6b);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,":",1);
          poVar3 = (ostream *)std::ostream::operator<<((ostream *)local_1a0,0x53);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3," t.charset()==\"\"",0x10);
          prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::__cxx11::stringbuf::str();
          std::runtime_error::runtime_error(prVar4,(string *)local_1d0);
          __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"Error ",6);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a0,
                   "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/content_type_parser_test.cpp"
                   ,0x6b);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,":",1);
        poVar3 = (ostream *)std::ostream::operator<<((ostream *)local_1a0,0x52);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar3," t.media_type()==\"foo/bar\"",0x1a);
        prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::runtime_error::runtime_error(prVar4,(string *)local_1d0);
        __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"Error ",6);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a0,
                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/content_type_parser_test.cpp"
                 ,0x6b);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,":",1);
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)local_1a0,0x43);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," t.type()==\"\"",0xd);
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar4,(string *)local_1d0);
      __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a0,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/content_type_parser_test.cpp"
               ,0x6b);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,":",1);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)local_1a0,0x31);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3," t.parameter_by_key(\"beep\")==\"x\\\"\"",0x22);
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar4,(string *)local_1d0);
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"Error ",6);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a0,
             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/content_type_parser_test.cpp"
             ,0x6b);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,":",1);
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)local_1a0,0x25);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," t.subtype()==\"world\"",0x15);
  prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(prVar4,(string *)local_1d0);
  __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

int main()
{
	try {
		using cppcms::http::content_type;
		{
			content_type t("hello/world");
			TEST(t.type()=="hello");
			TEST(t.subtype()=="world");
			TEST(t.media_type()=="hello/world");
		}
		{
			content_type t("Hello/WORLD; chaRset=UTF-8");
			TEST(t.type()=="hello");
			TEST(t.subtype()=="world");
			TEST(t.media_type()=="hello/world");
			TEST(t.parameter_is_set("charset"));
			TEST(!t.parameter_is_set("xx"));
			TEST(t.charset()=="UTF-8");
		}
		{
			content_type t("hello/world ; chaRset=\"UTF-8\"");
			TEST(t.type()=="hello");
			TEST(t.subtype()=="world");
			TEST(t.media_type()=="hello/world");
			TEST(t.charset()=="UTF-8");
			TEST(t.parameter_is_set("charset"));
		}
		{
			content_type t("hello/world; foo=1; bar=2; beep=\"x\\\"\"; zee=hello");
			TEST(t.type()=="hello");
			TEST(t.subtype()=="world");
			TEST(t.media_type()=="hello/world");
			TEST(t.parameter_by_key("foo")=="1");
			TEST(t.parameter_by_key("bar")=="2");
			TEST(t.parameter_by_key("beep")=="x\"");
			TEST(t.parameter_by_key("zee")=="hello");
			TEST(t.parameter_by_key("x")=="");
		}
		{
			content_type t("foo");
			TEST(t.type()=="");
			TEST(t.subtype()=="");
			TEST(t.media_type()=="");
		}
		{
			content_type t("foo/");
			TEST(t.type()=="");
			TEST(t.subtype()=="");
			TEST(t.media_type()=="");
		}
		{
			content_type t("/foo");
			TEST(t.type()=="");
			TEST(t.subtype()=="");
			TEST(t.media_type()=="");
		}
		{
			content_type t("foo/bar;; charset=UTF-8");
			TEST(t.type()=="foo");
			TEST(t.subtype()=="bar");
			TEST(t.media_type()=="foo/bar");
			TEST(t.charset()=="");
		}
		{
			content_type t("foo/bar; charset=\"UTF-8");
			TEST(t.type()=="foo");
			TEST(t.subtype()=="bar");
			TEST(t.media_type()=="foo/bar");
			TEST(t.charset()=="");
		}
		
	}
	catch(std::exception const &e) {
		std::cerr << "Fail: " <<e.what() << std::endl;
		return 1;
	}
	std::cout << "Ok" << std::endl;
	return 0;
}